

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O1

bool __thiscall
cmExportFileGenerator::AddTargetNamespace
          (cmExportFileGenerator *this,string *input,cmGeneratorTarget *target,cmLocalGenerator *lg)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  long *plVar3;
  _Base_ptr p_Var4;
  ulong *puVar5;
  _Base_ptr p_Var6;
  string namespacedTarget;
  TargetOrString resolved;
  ulong *local_98;
  long local_90;
  ulong local_88;
  long lStack_80;
  string local_78;
  TargetOrString local_58;
  
  cmGeneratorTarget::ResolveTargetReference(&local_58,target,input,lg);
  if (local_58.Target != (cmGeneratorTarget *)0x0) {
    bVar2 = cmGeneratorTarget::IsImported(local_58.Target);
    if (!bVar2) {
      p_Var1 = &(this->ExportedTargets)._M_t._M_impl.super__Rb_tree_header;
      p_Var6 = (this->ExportedTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var4 = &p_Var1->_M_header;
      for (; p_Var6 != (_Base_ptr)0x0;
          p_Var6 = (&p_Var6->_M_left)[*(cmGeneratorTarget **)(p_Var6 + 1) < local_58.Target]) {
        if (*(cmGeneratorTarget **)(p_Var6 + 1) >= local_58.Target) {
          p_Var4 = p_Var6;
        }
      }
      p_Var6 = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var4 != p_Var1) &&
         (p_Var6 = p_Var4, local_58.Target < *(cmGeneratorTarget **)(p_Var4 + 1))) {
        p_Var6 = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)p_Var6 == p_Var1) {
        local_90 = 0;
        local_88 = local_88 & 0xffffffffffffff00;
        local_98 = &local_88;
        (*this->_vptr_cmExportFileGenerator[0xe])(this,&local_98,target,local_58.Target);
        if (local_90 == 0) {
          cmGeneratorTarget::GetName_abi_cxx11_(local_58.Target);
        }
        std::__cxx11::string::_M_assign((string *)input);
        local_78.field_2._M_allocated_capacity = local_88;
        local_78._M_dataplus._M_p = (pointer)local_98;
        if (local_98 == &local_88) goto LAB_00301990;
      }
      else {
        cmGeneratorTarget::GetExportName_abi_cxx11_(&local_78,local_58.Target);
        plVar3 = (long *)std::__cxx11::string::replace
                                   ((ulong)&local_78,0,(char *)0x0,
                                    (ulong)(this->Namespace)._M_dataplus._M_p);
        puVar5 = (ulong *)(plVar3 + 2);
        if ((ulong *)*plVar3 == puVar5) {
          local_88 = *puVar5;
          lStack_80 = plVar3[3];
          local_98 = &local_88;
        }
        else {
          local_88 = *puVar5;
          local_98 = (ulong *)*plVar3;
        }
        local_90 = plVar3[1];
        *plVar3 = (long)puVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::operator=((string *)input,(string *)&local_98);
        if (local_98 != &local_88) {
          operator_delete(local_98,local_88 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p == &local_78.field_2) goto LAB_00301990;
      }
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      goto LAB_00301990;
    }
    cmGeneratorTarget::GetName_abi_cxx11_(local_58.Target);
  }
  std::__cxx11::string::_M_assign((string *)input);
LAB_00301990:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.String._M_dataplus._M_p != &local_58.String.field_2) {
    operator_delete(local_58.String._M_dataplus._M_p,
                    local_58.String.field_2._M_allocated_capacity + 1);
  }
  return local_58.Target != (cmGeneratorTarget *)0x0;
}

Assistant:

bool cmExportFileGenerator::AddTargetNamespace(std::string& input,
                                               cmGeneratorTarget const* target,
                                               cmLocalGenerator const* lg)
{
  cmGeneratorTarget::TargetOrString resolved =
    target->ResolveTargetReference(input, lg);

  cmGeneratorTarget* tgt = resolved.Target;
  if (!tgt) {
    input = resolved.String;
    return false;
  }

  if (tgt->IsImported()) {
    input = tgt->GetName();
    return true;
  }
  if (this->ExportedTargets.find(tgt) != this->ExportedTargets.end()) {
    input = this->Namespace + tgt->GetExportName();
  } else {
    std::string namespacedTarget;
    this->HandleMissingTarget(namespacedTarget, target, tgt);
    if (!namespacedTarget.empty()) {
      input = namespacedTarget;
    } else {
      input = tgt->GetName();
    }
  }
  return true;
}